

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.c
# Opt level: O1

size_t bitset_extract_setbits_sse_uint16
                 (uint64_t *words,size_t length,uint16_t *out,size_t outcapacity,uint16_t base)

{
  undefined1 (*pauVar1) [16];
  byte bVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  short sVar6;
  ulong uVar7;
  undefined1 (*pauVar8) [16];
  byte bVar10;
  ulong uVar9;
  int iVar11;
  uint64_t uVar12;
  ulong uVar13;
  undefined2 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar16 [64];
  
  pauVar1 = (undefined1 (*) [16])(out + outcapacity);
  pauVar8 = (undefined1 (*) [16])out;
  if ((long)outcapacity < 0x10 || length == 0) {
    uVar13 = 0;
  }
  else {
    uVar14 = (undefined2)(base - 1);
    auVar16 = ZEXT1664(CONCAT214(uVar14,CONCAT212(uVar14,CONCAT210(uVar14,CONCAT28(uVar14,CONCAT26(
                                                  uVar14,CONCAT24(uVar14,CONCAT22(uVar14,uVar14)))))
                                                 )));
    auVar17._8_2_ = 0x40;
    auVar17._0_8_ = 0x40004000400040;
    auVar17._10_2_ = 0x40;
    auVar17._12_2_ = 0x40;
    auVar17._14_2_ = 0x40;
    uVar13 = 0;
    auVar18._8_2_ = 8;
    auVar18._0_8_ = 0x8000800080008;
    auVar18._10_2_ = 8;
    auVar18._12_2_ = 8;
    auVar18._14_2_ = 8;
    auVar19._8_2_ = 0x10;
    auVar19._0_8_ = 0x10001000100010;
    auVar19._10_2_ = 0x10;
    auVar19._12_2_ = 0x10;
    auVar19._14_2_ = 0x10;
    do {
      if (words[uVar13] == 0) {
        auVar4 = vpaddw_avx(auVar16._0_16_,auVar17);
        auVar16 = ZEXT1664(auVar4);
      }
      else {
        iVar11 = 4;
        uVar12 = words[uVar13];
        do {
          bVar2 = ""[uVar12 & 0xff];
          bVar10 = (byte)(uVar12 >> 8);
          bVar3 = ""[bVar10];
          auVar15 = auVar16._0_16_;
          auVar4 = vpaddw_avx(auVar15,*(undefined1 (*) [16])
                                       ((long)vecDecodeTable_uint16[0] +
                                       (ulong)(uint)((int)(uVar12 & 0xff) << 4)));
          auVar5 = vpaddw_avx(auVar15,(undefined1  [16])vecDecodeTable_uint16[bVar10]);
          auVar5 = vpaddw_avx(auVar5,auVar18);
          auVar15 = vpaddw_avx(auVar15,auVar19);
          auVar16 = ZEXT1664(auVar15);
          *pauVar8 = auVar4;
          *(undefined1 (*) [16])(*pauVar8 + (ulong)bVar2 * 2) = auVar5;
          pauVar8 = (undefined1 (*) [16])
                    (*(undefined1 (*) [16])(*pauVar8 + (ulong)bVar2 * 2) + (ulong)bVar3 * 2);
          iVar11 = iVar11 + -1;
          uVar12 = uVar12 >> 0x10;
        } while (iVar11 != 0);
      }
      uVar13 = uVar13 + 1;
    } while ((uVar13 < length) && (pauVar8 + 2 <= pauVar1));
  }
  if ((uVar13 < length) && (pauVar8 < pauVar1)) {
    iVar11 = (uint)base + (int)uVar13 * 0x40;
    do {
      uVar9 = words[uVar13];
      if (uVar9 != 0) {
        do {
          sVar6 = 0;
          for (uVar7 = uVar9; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x8000000000000000) {
            sVar6 = sVar6 + 1;
          }
          *(short *)*pauVar8 = sVar6 + (short)iVar11;
          pauVar8 = (undefined1 (*) [16])(*pauVar8 + 2);
          uVar9 = uVar9 - 1 & uVar9;
        } while ((uVar9 != 0) && (pauVar8 < pauVar1));
      }
      uVar13 = uVar13 + 1;
    } while ((uVar13 < length) && (iVar11 = iVar11 + 0x40, pauVar8 < pauVar1));
  }
  return (long)pauVar8 - (long)out >> 1;
}

Assistant:

CROARING_TARGET_AVX2
size_t bitset_extract_setbits_sse_uint16(const uint64_t *words, size_t length,
                                         uint16_t *out, size_t outcapacity,
                                         uint16_t base) {
    uint16_t *initout = out;
    __m128i baseVec = _mm_set1_epi16(base - 1);
    __m128i incVec = _mm_set1_epi16(64);
    __m128i add8 = _mm_set1_epi16(8);
    uint16_t *safeout = out + outcapacity;
    const int numberofbytes = 2;  // process two bytes at a time
    size_t i = 0;
    for (; (i < length) && (out + numberofbytes * 8 <= safeout); ++i) {
        uint64_t w = words[i];
        if (w == 0) {
            baseVec = _mm_add_epi16(baseVec, incVec);
        } else {
            for (int k = 0; k < 4; ++k) {
                uint8_t byteA = (uint8_t)w;
                uint8_t byteB = (uint8_t)(w >> 8);
                w >>= 16;
                __m128i vecA = _mm_loadu_si128(
                    (const __m128i *)vecDecodeTable_uint16[byteA]);
                __m128i vecB = _mm_loadu_si128(
                    (const __m128i *)vecDecodeTable_uint16[byteB]);
                uint8_t advanceA = lengthTable[byteA];
                uint8_t advanceB = lengthTable[byteB];
                vecA = _mm_add_epi16(baseVec, vecA);
                baseVec = _mm_add_epi16(baseVec, add8);
                vecB = _mm_add_epi16(baseVec, vecB);
                baseVec = _mm_add_epi16(baseVec, add8);
                _mm_storeu_si128((__m128i *)out, vecA);
                out += advanceA;
                _mm_storeu_si128((__m128i *)out, vecB);
                out += advanceB;
            }
        }
    }
    base += (uint16_t)(i * 64);
    for (; (i < length) && (out < safeout); ++i) {
        uint64_t w = words[i];
        while ((w != 0) && (out < safeout)) {
            uint64_t t = w & (~w + 1);
            int r = roaring_trailing_zeroes(w);
            *out = (uint16_t)(r + base);
            out++;
            w ^= t;
        }
        base += 64;
    }
    return out - initout;
}